

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O0

void SUNDlsMat_SetToZero(SUNDlsMat A)

{
  long lVar1;
  long lVar2;
  sunrealtype *psVar3;
  long lVar4;
  long lVar5;
  sunrealtype *col_j;
  sunindextype colSize;
  sunindextype j;
  sunindextype i;
  SUNDlsMat A_local;
  
  if (A->type == 1) {
    for (j = 0; j < A->N; j = j + 1) {
      psVar3 = A->cols[j];
      for (i = 0; i < A->M; i = i + 1) {
        psVar3[i] = 0.0;
      }
    }
  }
  else if (A->type == 2) {
    lVar1 = A->mu;
    lVar2 = A->ml;
    for (j = 0; j < A->M; j = j + 1) {
      psVar3 = A->cols[j];
      lVar4 = A->s_mu;
      lVar5 = A->mu;
      for (i = 0; i < lVar1 + lVar2 + 1; i = i + 1) {
        psVar3[lVar4 + (i - lVar5)] = 0.0;
      }
    }
  }
  return;
}

Assistant:

void SUNDlsMat_SetToZero(SUNDlsMat A)
{
  sunindextype i, j, colSize;
  sunrealtype* col_j;

  switch (A->type)
  {
  case SUNDIALS_DENSE:

    for (j = 0; j < A->N; j++)
    {
      col_j = A->cols[j];
      for (i = 0; i < A->M; i++) { col_j[i] = ZERO; }
    }

    break;

  case SUNDIALS_BAND:

    colSize = A->mu + A->ml + 1;
    for (j = 0; j < A->M; j++)
    {
      col_j = A->cols[j] + A->s_mu - A->mu;
      for (i = 0; i < colSize; i++) { col_j[i] = ZERO; }
    }

    break;
  }
}